

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.h
# Opt level: O0

void __thiscall GrcManager::SetTableVersion(GrcManager *this,int ti,int fxdVersion)

{
  int fxdVersion_local;
  int ti_local;
  GrcManager *this_local;
  
  switch(ti) {
  case 0x12:
    this->m_fxdFeatTableVersion = fxdVersion;
    break;
  case 0x13:
    this->m_fxdGlatTableVersion = fxdVersion;
    break;
  case 0x14:
    this->m_fxdGlocTableVersion = fxdVersion;
    break;
  case 0x15:
    this->m_fxdSilfTableVersion = fxdVersion;
    break;
  default:
    break;
  case 0x17:
    this->m_fxdSillTableVersion = fxdVersion;
  }
  return;
}

Assistant:

void SetTableVersion(int ti, int fxdVersion)
	{
		switch (ti)
		{
		case ktiSilf:	m_fxdSilfTableVersion = fxdVersion; break;
		case ktiGloc:	m_fxdGlocTableVersion = fxdVersion;	break;
		case ktiGlat:	m_fxdGlatTableVersion = fxdVersion;	break;
		case ktiFeat:	m_fxdFeatTableVersion = fxdVersion;	break;
		case ktiSill:	m_fxdSillTableVersion = fxdVersion;	break;
		default:
			break;
		}
	}